

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O0

void pybind11::detail::enable_dynamic_attributes(PyHeapTypeObject *heap_type)

{
  PyTypeObject *type;
  PyHeapTypeObject *heap_type_local;
  
  (heap_type->ht_type).tp_flags = (heap_type->ht_type).tp_flags | 0x4000;
  (heap_type->ht_type).tp_dictoffset = (heap_type->ht_type).tp_basicsize;
  (heap_type->ht_type).tp_basicsize = (heap_type->ht_type).tp_basicsize + 8;
  (heap_type->ht_type).tp_traverse = pybind11_traverse;
  (heap_type->ht_type).tp_clear = pybind11_clear;
  (heap_type->ht_type).tp_getset = enable_dynamic_attributes::getset;
  return;
}

Assistant:

inline void enable_dynamic_attributes(PyHeapTypeObject *heap_type) {
    auto type = &heap_type->ht_type;
#if defined(PYPY_VERSION)
    pybind11_fail(std::string(type->tp_name) + ": dynamic attributes are "
                                               "currently not supported in "
                                               "conjunction with PyPy!");
#endif
    type->tp_flags |= Py_TPFLAGS_HAVE_GC;
    type->tp_dictoffset = type->tp_basicsize; // place dict at the end
    type->tp_basicsize += (ssize_t)sizeof(PyObject *); // and allocate enough space for it
    type->tp_traverse = pybind11_traverse;
    type->tp_clear = pybind11_clear;

    static PyGetSetDef getset[] = {
        {const_cast<char*>("__dict__"), pybind11_get_dict, pybind11_set_dict, nullptr, nullptr},
        {nullptr, nullptr, nullptr, nullptr, nullptr}
    };
    type->tp_getset = getset;
}